

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_move_8_d_pi7(void)

{
  uint addr_in;
  ulong uVar1;
  
  addr_in = m68ki_cpu.dar[0xf];
  m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] + 2;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68ki_cpu.n_flag = m68k_read_memory_8(addr_in & m68ki_cpu.address_mask);
  uVar1 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  *(uint *)((long)m68ki_cpu.dar + uVar1) =
       *(uint *)((long)m68ki_cpu.dar + uVar1) & 0xffffff00 | m68ki_cpu.n_flag;
  m68ki_cpu.not_z_flag = m68ki_cpu.n_flag;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_8_d_pi7(void)
{
	uint res = OPER_A7_PI_8();
	uint* r_dst = &DX;

	*r_dst = MASK_OUT_BELOW_8(*r_dst) | res;

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}